

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O0

void __thiscall
glslang::TParseContext::computeBuiltinPrecisions
          (TParseContext *this,TIntermTyped *node,TFunction *function)

{
  TPrecisionQualifier TVar1;
  bool bVar2;
  int iVar3;
  TOperator TVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  long lVar5;
  long *plVar6;
  TPrecisionQualifier *pTVar7;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  size_type sVar8;
  reference ppTVar9;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  TPrecisionQualifier local_6c;
  TPrecisionQualifier local_64;
  TPrecisionQualifier local_60;
  TPrecisionQualifier local_5c;
  uint local_58;
  uint local_54;
  uint arg;
  uint numArgs;
  TIntermSequence *sequence;
  TIntermAggregate *agg;
  long *local_38;
  TIntermUnary *unaryNode;
  TIntermOperator *opNode;
  TPrecisionQualifier resultPrecision;
  TPrecisionQualifier operationPrecision;
  TFunction *function_local;
  TIntermTyped *node_local;
  TParseContext *this_local;
  
  opNode._4_4_ = EpqNone;
  opNode._0_4_ = EpqNone;
  _resultPrecision = function;
  function_local = (TFunction *)node;
  node_local = (TIntermTyped *)this;
  iVar3 = (*(node->super_TIntermNode)._vptr_TIntermNode[4])();
  unaryNode = (TIntermUnary *)CONCAT44(extraout_var,iVar3);
  if (unaryNode != (TIntermUnary *)0x0) {
    iVar3 = (*(function_local->super_TSymbol)._vptr_TSymbol[7])();
    local_38 = (long *)CONCAT44(extraout_var_00,iVar3);
    if (local_38 == (long *)0x0) {
      iVar3 = (*(function_local->super_TSymbol)._vptr_TSymbol[6])();
      sequence = (TIntermSequence *)CONCAT44(extraout_var_05,iVar3);
      if (sequence != (TIntermSequence *)0x0) {
        _arg = (vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
               (*(code *)(sequence->
                         super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>).
                         super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
                         _M_impl.super__Tp_alloc_type.allocator[4].alignmentMask)();
        sVar8 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::size(_arg);
        local_54 = (uint)sVar8;
        TVar4 = TIntermOperator::getOp((TIntermOperator *)sequence);
        if (TVar4 - EOpInterpolateAtCentroid < 3) {
          local_54 = 1;
        }
        else if ((TVar4 - EOpCooperativeMatrixReduceNV < 2) || (TVar4 == EOpDebugPrintf)) {
          local_54 = 0;
        }
        else if (TVar4 == EOpBitfieldExtract) {
          local_54 = 1;
        }
        else if (TVar4 == EOpBitfieldInsert) {
          local_54 = 2;
        }
        for (local_58 = 0; local_58 < local_54; local_58 = local_58 + 1) {
          ppTVar9 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::operator[]
                              (_arg,(ulong)local_58);
          iVar3 = (*(*ppTVar9)->_vptr_TIntermNode[3])();
          lVar5 = (**(code **)(*(long *)CONCAT44(extraout_var_06,iVar3) + 0x108))();
          local_5c = (TPrecisionQualifier)(*(ulong *)(lVar5 + 8) >> 0x19) & 7;
          pTVar7 = std::max<glslang::TPrecisionQualifier>
                             ((TPrecisionQualifier *)((long)&opNode + 4),&local_5c);
          opNode._4_4_ = *pTVar7;
          iVar3 = (*(_resultPrecision->super_TSymbol)._vptr_TSymbol[0x28])
                            (_resultPrecision,(ulong)local_58);
          lVar5 = (**(code **)(**(long **)(CONCAT44(extraout_var_07,iVar3) + 8) + 0x50))();
          local_60 = (TPrecisionQualifier)(*(ulong *)(lVar5 + 8) >> 0x19) & 7;
          pTVar7 = std::max<glslang::TPrecisionQualifier>
                             ((TPrecisionQualifier *)((long)&opNode + 4),&local_60);
          opNode._4_4_ = *pTVar7;
        }
        bVar2 = TIntermOperator::isSampling((TIntermOperator *)sequence);
        if ((((bVar2) ||
             (TVar4 = TIntermOperator::getOp((TIntermOperator *)sequence), TVar4 == EOpImageLoad))
            || (TVar4 = TIntermOperator::getOp((TIntermOperator *)sequence), TVar4 == EOpImageStore)
            ) || ((TVar4 = TIntermOperator::getOp((TIntermOperator *)sequence),
                  TVar4 == EOpImageLoadLod ||
                  (TVar4 = TIntermOperator::getOp((TIntermOperator *)sequence),
                  TVar4 == EOpImageStoreLod)))) {
          ppTVar9 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::operator[]
                              (_arg,0);
          iVar3 = (*(*ppTVar9)->_vptr_TIntermNode[3])();
          lVar5 = (**(code **)(*(long *)CONCAT44(extraout_var_08,iVar3) + 0x108))();
          opNode._0_4_ = (TPrecisionQualifier)(*(ulong *)(lVar5 + 8) >> 0x19) & 7;
        }
        else {
          iVar3 = (*(_resultPrecision->super_TSymbol)._vptr_TSymbol[0xc])();
          iVar3 = (**(code **)(*(long *)CONCAT44(extraout_var_09,iVar3) + 0x38))();
          if (iVar3 != 0xc) {
            iVar3 = (*(_resultPrecision->super_TSymbol)._vptr_TSymbol[0xc])();
            lVar5 = (**(code **)(*(long *)CONCAT44(extraout_var_10,iVar3) + 0x58))();
            if ((*(ulong *)(lVar5 + 8) >> 0x19 & 7) == 0) {
              local_6c = opNode._4_4_;
            }
            else {
              iVar3 = (*(_resultPrecision->super_TSymbol)._vptr_TSymbol[0xc])();
              lVar5 = (**(code **)(*(long *)CONCAT44(extraout_var_11,iVar3) + 0x58))();
              local_6c = (TPrecisionQualifier)(*(ulong *)(lVar5 + 8) >> 0x19) & 7;
            }
            opNode._0_4_ = local_6c;
          }
        }
      }
    }
    else {
      iVar3 = (*(_resultPrecision->super_TSymbol)._vptr_TSymbol[0x28])(_resultPrecision,0);
      lVar5 = (**(code **)(**(long **)(CONCAT44(extraout_var_01,iVar3) + 8) + 0x50))();
      agg._4_4_ = (uint)(*(ulong *)(lVar5 + 8) >> 0x19) & 7;
      plVar6 = (long *)(**(code **)(*local_38 + 0x188))();
      plVar6 = (long *)(**(code **)(*plVar6 + 0xf0))();
      lVar5 = (**(code **)(*plVar6 + 0x58))();
      agg._0_4_ = (uint)(*(ulong *)(lVar5 + 8) >> 0x19) & 7;
      pTVar7 = std::max<glslang::TPrecisionQualifier>
                         ((TPrecisionQualifier *)((long)&agg + 4),(TPrecisionQualifier *)&agg);
      opNode._4_4_ = *pTVar7;
      iVar3 = (*(_resultPrecision->super_TSymbol)._vptr_TSymbol[0xc])();
      iVar3 = (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar3) + 0x38))();
      if (iVar3 != 0xc) {
        iVar3 = (*(_resultPrecision->super_TSymbol)._vptr_TSymbol[0xc])();
        lVar5 = (**(code **)(*(long *)CONCAT44(extraout_var_03,iVar3) + 0x58))();
        if ((*(ulong *)(lVar5 + 8) >> 0x19 & 7) == 0) {
          local_64 = opNode._4_4_;
        }
        else {
          iVar3 = (*(_resultPrecision->super_TSymbol)._vptr_TSymbol[0xc])();
          lVar5 = (**(code **)(*(long *)CONCAT44(extraout_var_04,iVar3) + 0x58))();
          local_64 = (TPrecisionQualifier)(*(ulong *)(lVar5 + 8) >> 0x19) & 7;
        }
        opNode._0_4_ = local_64;
      }
    }
    iVar3 = (*(unaryNode->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
              _vptr_TIntermNode[0x21])();
    *(ulong *)(CONCAT44(extraout_var_12,iVar3) + 8) =
         *(ulong *)(CONCAT44(extraout_var_12,iVar3) + 8) & 0xfffffffff1ffffff;
    if (opNode._4_4_ != EpqNone) {
      (*(unaryNode->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
        [0x25])(unaryNode,(ulong)opNode._4_4_);
      TIntermOperator::setOperationPrecision(&unaryNode->super_TIntermOperator,opNode._4_4_);
    }
    TVar1 = (TPrecisionQualifier)opNode;
    iVar3 = (*(unaryNode->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
              _vptr_TIntermNode[0x21])();
    *(ulong *)(CONCAT44(extraout_var_13,iVar3) + 8) =
         *(ulong *)(CONCAT44(extraout_var_13,iVar3) + 8) & 0xfffffffff1ffffff |
         ((ulong)TVar1 & 7) << 0x19;
  }
  return;
}

Assistant:

void TParseContext::computeBuiltinPrecisions(TIntermTyped& node, const TFunction& function)
{
    TPrecisionQualifier operationPrecision = EpqNone;
    TPrecisionQualifier resultPrecision = EpqNone;

    TIntermOperator* opNode = node.getAsOperator();
    if (opNode == nullptr)
        return;

    if (TIntermUnary* unaryNode = node.getAsUnaryNode()) {
        operationPrecision = std::max(function[0].type->getQualifier().precision,
                                      unaryNode->getOperand()->getType().getQualifier().precision);
        if (function.getType().getBasicType() != EbtBool)
            resultPrecision = function.getType().getQualifier().precision == EpqNone ?
                                        operationPrecision :
                                        function.getType().getQualifier().precision;
    } else if (TIntermAggregate* agg = node.getAsAggregate()) {
        TIntermSequence& sequence = agg->getSequence();
        unsigned int numArgs = (unsigned int)sequence.size();
        switch (agg->getOp()) {
        case EOpBitfieldExtract:
            numArgs = 1;
            break;
        case EOpBitfieldInsert:
            numArgs = 2;
            break;
        case EOpInterpolateAtCentroid:
        case EOpInterpolateAtOffset:
        case EOpInterpolateAtSample:
            numArgs = 1;
            break;
        case EOpDebugPrintf:
        case EOpCooperativeMatrixPerElementOpNV:
        case EOpCooperativeMatrixReduceNV:
            numArgs = 0;
            break;
        default:
            break;
        }
        // find the maximum precision from the arguments and parameters
        for (unsigned int arg = 0; arg < numArgs; ++arg) {
            operationPrecision = std::max(operationPrecision, sequence[arg]->getAsTyped()->getQualifier().precision);
            operationPrecision = std::max(operationPrecision, function[arg].type->getQualifier().precision);
        }
        // compute the result precision
        if (agg->isSampling() ||
            agg->getOp() == EOpImageLoad || agg->getOp() == EOpImageStore ||
            agg->getOp() == EOpImageLoadLod || agg->getOp() == EOpImageStoreLod)
            resultPrecision = sequence[0]->getAsTyped()->getQualifier().precision;
        else if (function.getType().getBasicType() != EbtBool)
            resultPrecision = function.getType().getQualifier().precision == EpqNone ?
                                        operationPrecision :
                                        function.getType().getQualifier().precision;
    }

    // Propagate precision through this node and its children. That algorithm stops
    // when a precision is found, so start by clearing this subroot precision
    opNode->getQualifier().precision = EpqNone;
    if (operationPrecision != EpqNone) {
        opNode->propagatePrecision(operationPrecision);
        opNode->setOperationPrecision(operationPrecision);
    }
    // Now, set the result precision, which might not match
    opNode->getQualifier().precision = resultPrecision;
}